

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::cbtAxisSweep3Internal
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *worldAabbMin,
          cbtVector3 *worldAabbMax,uint handleMask,uint handleSentinel,uint userMaxHandles,
          cbtOverlappingPairCache *pairCache,bool disableRaycastAccelerator)

{
  uint uVar1;
  Edge *pEVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  cbtHashedOverlappingPairCache *this_00;
  cbtOverlappingPairCache *pcVar6;
  cbtDbvtBroadphase *this_01;
  Handle *pHVar7;
  void *pvVar8;
  ulong uVar9;
  Handle *pHVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  auVar23 = in_ZMM1._0_16_;
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtAxisSweep3Internal_00b47348;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (cbtOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (cbtDbvtBroadphase *)0x0;
  if (pairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  uVar1 = userMaxHandles + 1;
  if (!disableRaycastAccelerator) {
    pcVar6 = (cbtOverlappingPairCache *)cbtAlignedAllocInternal(0x28,0x10);
    pcVar6[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar6[2].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar6[3].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    pcVar6[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = (_func_int **)0x0;
    (pcVar6->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback =
         (_func_int **)&PTR__cbtNullPairCache_00b47268;
    *(undefined1 *)&pcVar6[4].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pcVar6[1].super_cbtOverlappingPairCallback._vptr_cbtOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pcVar6;
    this_01 = (cbtDbvtBroadphase *)cbtAlignedAllocInternal(0x100,0x10);
    cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar5 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar5;
  uVar12 = (ulong)uVar1;
  uVar5 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar5;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(this->m_worldAabbMin).m_floats;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(this->m_worldAabbMax).m_floats;
  auVar4 = vcvtusi2ss_avx512f(auVar23,this->m_handleSentinel);
  auVar23 = vsubps_avx(auVar25,auVar24);
  fVar22 = auVar4._0_4_;
  auVar26._4_4_ = fVar22;
  auVar26._0_4_ = fVar22;
  auVar26._8_4_ = fVar22;
  auVar26._12_4_ = fVar22;
  auVar21._0_4_ = fVar22 / ((this->m_worldAabbMax).m_floats[2] - (this->m_worldAabbMin).m_floats[2])
  ;
  auVar21._4_12_ = auVar4._4_12_;
  auVar23 = vdivps_avx(auVar26,auVar23);
  auVar23 = vinsertps_avx(auVar23,auVar21,0x28);
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar23;
  pHVar7 = (Handle *)cbtAlignedAllocInternal(uVar12 * 0x58,0x10);
  if (uVar1 == 0) {
    this->m_pHandles = pHVar7;
    this->m_maxHandles = 0;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
  }
  else {
    auVar3 = vpmovsxwd_avx2(_DAT_009eba80);
    uVar9 = 0;
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vpsrlq_avx512f(auVar14,4);
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pHVar10 = pHVar7;
    do {
      auVar16 = vpbroadcastq_avx512f();
      uVar9 = uVar9 + 8;
      auVar16 = vporq_avx512f(auVar16,auVar15);
      uVar5 = vpcmpuq_avx512f(auVar16,auVar14,2);
      vpscatterdq_avx512f(ZEXT864(pHVar10) + ZEXT3264(auVar3),uVar5,ZEXT1664(ZEXT816(0) << 0x40));
      pHVar10 = pHVar10 + 8;
    } while (((uVar12 * 0x58 - 0x58) / 0x58 + 8 & 0xfffffffffffffff8) != uVar9);
    this->m_pHandles = pHVar7;
    this->m_maxHandles = uVar1;
    this->m_numHandles = 0;
    this->m_firstFreeHandle = 1;
    if (userMaxHandles != 0) {
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
      auVar17 = vpbroadcastq_avx512f(ZEXT816(0x58));
      auVar18 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar3 = vpcmpeqd_avx2(auVar16._0_32_,auVar16._0_32_);
      auVar16 = vpbroadcastq_avx512f();
      uVar9 = 0;
      do {
        auVar19 = vpbroadcastq_avx512f();
        auVar20 = vpmullq_avx512dq(auVar14,auVar17);
        uVar9 = uVar9 + 8;
        auVar19 = vporq_avx512f(auVar19,auVar15);
        uVar5 = vpcmpuq_avx512f(auVar19,auVar16,2);
        auVar13 = vpmovqd_avx512f(auVar14);
        auVar14 = vpaddq_avx512f(auVar14,auVar18);
        auVar13 = vpsubd_avx2(auVar13,auVar3);
        vpscatterqd_avx512f(ZEXT832(pHVar7) + ZEXT832(0x34) + auVar20._0_32_,uVar5,auVar13);
      } while ((uVar12 + 6 & 0xfffffffffffffff8) != uVar9);
    }
  }
  lVar11 = -3;
  *(undefined4 *)&pHVar7[userMaxHandles].super_cbtBroadphaseProxy.field_0x34 = 0;
  do {
    pvVar8 = cbtAlignedAllocInternal(uVar12 << 4,0x10);
    this->m_pEdgesRawPtr[lVar11 + 3] = pvVar8;
    this->m_pEdgesRawPtr[lVar11] = pvVar8;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  pHVar7 = this->m_pHandles;
  lVar11 = 0;
  (pHVar7->super_cbtBroadphaseProxy).m_clientObject = (void *)0x0;
  do {
    *(undefined4 *)((long)(&(pHVar7->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar11 * 4) = 0;
    pHVar7->m_maxEdges[lVar11] = 1;
    pEVar2 = this->m_pEdges[lVar11];
    lVar11 = lVar11 + 1;
    pEVar2->m_pos = 0;
    pEVar2->m_handle = 0;
    pEVar2[1].m_pos = this->m_handleSentinel;
    pEVar2[1].m_handle = 0;
  } while (lVar11 != 3);
  return;
}

Assistant:

cbtAxisSweep3Internal<BP_FP_INT_TYPE>::cbtAxisSweep3Internal(const cbtVector3& worldAabbMin, const cbtVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel, BP_FP_INT_TYPE userMaxHandles, cbtOverlappingPairCache* pairCache, bool disableRaycastAccelerator)
	: m_bpHandleMask(handleMask),
	  m_handleSentinel(handleSentinel),
	  m_pairCache(pairCache),
	  m_userPairCallback(0),
	  m_ownsPairCache(false),
	  m_invalidPair(0),
	  m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles + 1);  //need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (ptr) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (cbtAlignedAlloc(sizeof(cbtNullPairCache), 16)) cbtNullPairCache();
		m_raycastAccelerator = new (cbtAlignedAlloc(sizeof(cbtDbvtBroadphase), 16)) cbtDbvtBroadphase(m_nullPairCache);  //m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;                                                                //don't add/remove pairs
	}

	//cbtAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	cbtVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE maxInt = m_handleSentinel;

	m_quantize = cbtVector3(cbtScalar(maxInt), cbtScalar(maxInt), cbtScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using cbtAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];

	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = cbtAlignedAlloc(sizeof(Edge) * maxHandles * 2, 16);
			m_pEdges[i] = new (m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels

	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif  //DEBUG_BROADPHASE
	}
}